

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.cpp
# Opt level: O2

void __thiscall MathML::AST::ConstantExpression::ConstantExpression(ConstantExpression *this)

{
  (this->super_INode)._vptr_INode = (_func_int **)&PTR__ConstantExpression_00a05bd8;
  this->mType = SCALAR_INVALID;
  (this->mStringValue)._M_dataplus._M_p = (pointer)&(this->mStringValue).field_2;
  (this->mStringValue)._M_string_length = 0;
  (this->mStringValue).field_2._M_local_buf[0] = '\0';
  this->mErrorHandler = (ErrorHandler *)0x0;
  return;
}

Assistant:

ConstantExpression::ConstantExpression()
                : mType ( SCALAR_INVALID )
                , mErrorHandler( 0 )
        {}